

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O3

char * get_dir_path(char *path,char *dist)

{
  char *pcVar1;
  char acStack_118 [264];
  
  if (dist != (char *)0x0) {
    strcpy(acStack_118,path);
    pcVar1 = point_basename(acStack_118);
    if (pcVar1 != (char *)0x0) {
      *pcVar1 = '\0';
    }
    memset(dist,0,0x104);
    strcpy(dist,acStack_118);
  }
  return dist;
}

Assistant:

char *get_dir_path(const char *path, char *dist)
{
#if defined(_WIN32)
	char drive[MAX_PATH];
	if (!get_drive(path, drive))
	{
		return NULL;
	}
	char dir[MAX_PATH];
	if (!get_dir(path, dir))
	{
		return NULL;
	}
	if (strlen(drive) + strlen(dir) + 1 > MAX_PATH)
	{
		return NULL;
	}
	return strcat(strcpy(dist, drive), dir);
#else
	return get_dir(path, dist);
#endif
}